

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::SharedDtor
          (UniDirectionalLSTMLayerParams *this)

{
  UniDirectionalLSTMLayerParams *pUVar1;
  UniDirectionalLSTMLayerParams *this_local;
  
  pUVar1 = internal_default_instance();
  if ((this != pUVar1) && (this->params_ != (LSTMParams *)0x0)) {
    (*(this->params_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pUVar1 = internal_default_instance();
  if ((this != pUVar1) && (this->weightparams_ != (LSTMWeightParams *)0x0)) {
    (*(this->weightparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete params_;
  }
  if (this != internal_default_instance()) {
    delete weightparams_;
  }
}